

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.cpp
# Opt level: O0

bool __thiscall r_code::Atom::readsAsNil(Atom *this)

{
  bool local_11;
  Atom *this_local;
  
  local_11 = true;
  if ((((this->atom != 0x80000000) && (local_11 = true, this->atom != 0x3fffffff)) &&
      (local_11 = true, this->atom != 0x81ffffff)) &&
     (((local_11 = true, this->atom != 0xc1000000 && (local_11 = true, this->atom != 0xa0ffffff)) &&
      ((local_11 = true, this->atom != 0xa1ffffff && (local_11 = true, this->atom != 0xa2ffffff)))))
     ) {
    local_11 = this->atom == 0xc6ffffff;
  }
  return local_11;
}

Assistant:

bool Atom::readsAsNil() const
{
    return atom == 0x80000000 ||
           atom == 0x3FFFFFFF ||
           atom == 0x81FFFFFF ||
           atom == 0xC1000000 ||
           atom == 0xA0FFFFFF ||
           atom == 0xA1FFFFFF ||
           atom == 0xA2FFFFFF ||
           atom == 0xC6FFFFFF;
}